

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O1

void __thiscall rw::Geometry::buildTristrips(Geometry *this)

{
  uint32 *puVar1;
  long *plVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  Triangle *pTVar12;
  long ****pppplVar13;
  MeshHeader *pMVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  undefined4 *object;
  long lVar20;
  long ****pppplVar21;
  int32 j;
  long lVar22;
  uint uVar23;
  long lVar24;
  long ****pppplVar25;
  int32 i;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  MeshHeader *pMVar32;
  byte bVar33;
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  StripMesh smesh;
  int local_90;
  long ***local_80;
  long ***local_78;
  long ***local_70;
  long ***local_68;
  MeshHeader *local_60;
  long local_58;
  MaterialList *local_50;
  long local_48;
  MeshHeader *local_40;
  MeshHeader *local_38;
  ulong uVar31;
  
  local_50 = &this->matList;
  allocateMeshes(this,(this->matList).numMaterials,0,1);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 575"
  ;
  lVar15 = (*DAT_00148858)((long)this->numTriangles * 0x38,0x1000f);
  pMVar32 = this->meshHeader;
  if (0 < (this->matList).numMaterials) {
    local_40 = pMVar32 + 1;
    local_58 = 0;
    local_38 = pMVar32;
    do {
      local_80 = (long ***)&local_80;
      local_70 = (long ***)&local_70;
      local_90 = 0;
      if (0 < this->numTriangles) {
        lVar16 = 0;
        do {
          pTVar12 = this->triangles;
          if (pTVar12[lVar16].matId == (uint16)local_58) {
            lVar24 = (long)local_90;
            local_90 = local_90 + 1;
            lVar24 = lVar24 * 0x38;
            *(uint16 *)(lVar15 + lVar24) = pTVar12[lVar16].v[0];
            *(uint16 *)(lVar15 + 2 + lVar24) = pTVar12[lVar16].v[1];
            *(uint16 *)(lVar15 + 4 + lVar24) = pTVar12[lVar16].v[2];
            *(undefined4 *)(lVar15 + 8 + lVar24) = 0;
            *(undefined4 *)(lVar15 + 0x10 + lVar24) = 0;
            *(undefined4 *)(lVar15 + 0x18 + lVar24) = 0;
            pbVar3 = (byte *)(lVar15 + 0xc + lVar24);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar15 + 0x14 + lVar24);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar15 + 0x1c + lVar24);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar15 + 6 + lVar24);
            *pbVar3 = *pbVar3 & 0xe0;
            *(undefined4 *)(lVar15 + 0x20 + lVar24) = 0xffffffff;
            puVar4 = (undefined8 *)(lVar15 + 0x28 + lVar24);
            *puVar4 = 0;
            puVar4[1] = 0;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < this->numTriangles);
      }
      if (0 < local_90) {
        lVar16 = 0;
        do {
          local_48 = lVar16;
          local_60 = (MeshHeader *)(local_48 * 0x38 + lVar15);
          lVar16 = 0;
          do {
            bVar5 = *(byte *)((long)local_60 + 0xc + lVar16 * 8);
            if ((bVar5 & 1) == 0) {
              lVar24 = lVar16 + 1;
              if (lVar24 == 3) {
                lVar24 = 0;
              }
              uVar17 = 0;
              bVar39 = false;
              if (0 < (long)local_90) {
                uVar27 = 0;
                uVar17 = 0;
                bVar34 = 0;
                bVar39 = false;
                lVar22 = lVar15;
                do {
                  bVar33 = (bVar34 & 0xf8) + 1;
                  lVar18 = 1;
                  bVar38 = false;
                  do {
                    if (((*(byte *)(lVar22 + 4 + lVar18 * 8) & 1) == 0) &&
                       (*(short *)((long)local_60 + lVar24 * 2) ==
                        *(short *)(lVar22 + -2 + lVar18 * 2))) {
                      lVar20 = 0;
                      if (lVar18 != 3) {
                        lVar20 = lVar18;
                      }
                      if (*(short *)((long)local_60 + lVar16 * 2) ==
                          *(short *)(uVar27 * 0x38 + lVar15 + lVar20 * 2)) {
                        uVar17 = uVar27 & 0xffffffff;
                        bVar34 = bVar33;
                        bVar39 = true;
                        break;
                      }
                    }
                    bVar38 = 1 < lVar18 - 1U;
                    bVar33 = bVar33 + 2;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 4);
                  if (!bVar38) break;
                  uVar27 = uVar27 + 1;
                  lVar22 = lVar22 + 0x38;
                } while (uVar27 != (long)local_90);
                uVar17 = uVar17 | (ulong)bVar34 << 0x20;
              }
              if (bVar39) {
                *(int *)((long)local_60 + 8 + lVar16 * 8) = (int)uVar17;
                *(byte *)((long)local_60 + 0xc + lVar16 * 8) = bVar5 & 0xf0 | bVar39;
                lVar24 = (long)(int)uVar17 * 0x38 + lVar15;
                uVar17 = uVar17 >> 0x21;
                *(int *)(lVar24 + 8 + uVar17 * 8) = (int)local_48;
                *(byte *)(lVar24 + 0xc + uVar17 * 8) =
                     (*(byte *)(lVar24 + 0xc + uVar17 * 8) & 0xf0) + (char)lVar16 * '\x02' + '\x01';
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          lVar16 = local_48 + 1;
        } while (local_48 + 1 < (long)local_90);
      }
      local_78 = local_80;
      local_68 = local_70;
      if (0 < local_90) {
        lVar16 = 0;
        do {
          if (*(int *)(lVar15 + 0x20 + lVar16 * 0x38) < 0) {
            lVar24 = lVar15 + lVar16 * 0x38;
            *(int *)(lVar24 + 0x20) = (int)lVar16;
            pppplVar21 = (long ****)(lVar24 + 0x28);
            if ((*(byte *)(lVar24 + 0x1c) & 1) == 0 &&
                (byte)((*(byte *)(lVar24 + 0x14) & 1) + (*(byte *)(lVar24 + 0xc) & 1)) == '\0') {
              *(long *****)(lVar24 + 0x28) = &local_80;
              *(long ****)(lVar24 + 0x30) = local_78;
              *local_78 = (long **)pppplVar21;
              local_78 = (long ***)pppplVar21;
            }
            else {
              *(long *****)(lVar24 + 0x28) = &local_70;
              *(long ****)(lVar24 + 0x30) = local_68;
              *local_68 = (long **)pppplVar21;
              *(byte *)(lVar24 + 6) = *(byte *)(lVar24 + 6) | 0x10;
              lVar22 = lVar24;
              do {
                uVar17 = 0;
                bVar39 = false;
                do {
                  if (((*(byte *)(lVar22 + 0xc + uVar17 * 8) & 1) != 0) &&
                     (lVar18 = (long)*(int *)(lVar22 + 8 + uVar17 * 8) * 0x38,
                     *(int *)(lVar15 + 0x20 + lVar18) < 0)) {
                    *(undefined4 *)(lVar15 + lVar18 + 0x20) = *(undefined4 *)(lVar22 + 0x20);
                    bVar5 = *(byte *)(lVar22 + 0xc + uVar17 * 8);
                    *(byte *)(lVar22 + 0xc + uVar17 * 8) = bVar5 ^ 8;
                    pbVar3 = (byte *)(lVar18 + lVar15 + 0xc + (ulong)(bVar5 & 6) * 4);
                    *pbVar3 = *pbVar3 ^ 8;
                    lVar22 = lVar15 + lVar18;
                    break;
                  }
                  bVar39 = 1 < uVar17;
                  uVar17 = uVar17 + 1;
                } while (uVar17 != 3);
              } while (!bVar39);
              local_68 = (long ***)pppplVar21;
              if (lVar22 != lVar24) {
                local_68 = (long ***)(lVar22 + 0x28);
                *(long *****)(lVar22 + 0x28) = &local_70;
                *(long *****)(lVar22 + 0x30) = pppplVar21;
                *pppplVar21 = local_68;
                *(byte *)(lVar22 + 6) = *(byte *)(lVar22 + 6) | 0x10;
              }
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < local_90);
      }
      plVar2 = (long *)((long)local_40 + local_58 * 0x18);
      plVar2[2] = (long)local_50->materials[local_58];
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 456"
      ;
      pvVar19 = (void *)(*DAT_00148858)((long)local_90 * 10,0x1000f);
      *plVar2 = (long)pvVar19;
      memset(pvVar19,0xff,(long)local_90 * 10);
      if ((long ****)local_70 == &local_70) {
        uVar17 = 1;
      }
      else {
        uVar17 = 1;
        pppplVar21 = (long ****)local_70;
        do {
          pppplVar13 = (long ****)*pppplVar21;
          pppplVar25 = pppplVar21 + -5;
          if (((long)pppplVar25 - lVar15 >> 3) * 0x6db6db6db6db6db7 -
              (long)*(int *)(pppplVar21 + -1) == 0) {
            uVar27 = 0;
            do {
              if ((*(byte *)((long)pppplVar21 + uVar27 * 8 + -0x1c) & 8) != 0) goto LAB_00112cf4;
              uVar27 = uVar27 + 1;
            } while (uVar27 != 3);
            uVar27 = 0xffffffff;
LAB_00112cf4:
            iVar26 = (int)uVar27;
            if (-1 < iVar26) {
              iVar11 = (int)plVar2[1];
              local_60 = (MeshHeader *)(long)iVar11;
              if (local_60 != (MeshHeader *)0x0) {
                *(int *)(plVar2 + 1) = iVar11 + 2;
              }
              if ((int)uVar17 == 0) {
                uVar28 = (iVar26 + 1U) % 3;
                uVar35 = uVar28 + 1;
                if (uVar28 + 1 == 3) {
                  uVar35 = 0;
                }
                uVar6 = *(undefined2 *)((long)pppplVar25 + (ulong)uVar35 * 2);
                lVar16 = *plVar2;
                uVar35 = *(uint *)(plVar2 + 1);
                uVar37 = uVar35 + 1;
                *(uint *)(plVar2 + 1) = uVar37;
                *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) = uVar6;
                uVar31 = (ulong)uVar28;
              }
              else {
                uVar28 = (iVar26 + 2U) % 3;
                uVar31 = (ulong)uVar28;
                uVar6 = *(undefined2 *)((long)pppplVar25 + uVar31 * 2);
                lVar16 = *plVar2;
                uVar35 = *(uint *)(plVar2 + 1);
                uVar37 = uVar35 + 1;
                *(uint *)(plVar2 + 1) = uVar37;
                *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) = uVar6;
                uVar28 = uVar28 + 1;
                if (uVar28 == 3) {
                  uVar28 = 0;
                }
              }
              uVar6 = *(undefined2 *)((long)pppplVar25 + (ulong)uVar28 * 2);
              *(uint *)(plVar2 + 1) = uVar35 + 2;
              *(undefined2 *)(lVar16 + (ulong)uVar37 * 2) = uVar6;
              lVar16 = *plVar2;
              uVar35 = *(uint *)(plVar2 + 1);
              uVar28 = 0xffffffff;
              do {
                uVar36 = (ulong)uVar35;
                uVar29 = ((int)uVar31 + 1U) % 3;
                uVar30 = (uint)uVar27;
                uVar37 = (uint)(uVar29 == uVar30);
                uVar23 = (uint)uVar17;
                if (uVar28 == uVar37) {
                  *(undefined2 *)(*plVar2 + uVar36 * 2) =
                       *(undefined2 *)(*plVar2 + (ulong)(uVar35 - 2) * 2);
                  uVar36 = (ulong)(uVar35 + 1);
                  *(uint *)(plVar2 + 1) = uVar35 + 1;
                  uVar23 = (uint)(uVar23 == 0);
                }
                uVar17 = (ulong)(uVar30 + 1);
                if (uVar30 + 1 == 3) {
                  uVar17 = 0;
                }
                if (uVar29 != uVar30) {
                  uVar17 = uVar27 & 0xffffffff;
                }
                uVar6 = *(undefined2 *)((long)pppplVar25 + uVar17 * 2);
                uVar35 = (int)uVar36 + 1;
                *(uint *)(plVar2 + 1) = uVar35;
                *(undefined2 *)(lVar16 + uVar36 * 2) = uVar6;
                uVar17 = (ulong)(uVar23 == 0);
                uVar30 = *(byte *)((long)pppplVar25 + (uVar27 & 0xffffffff) * 8 + 0xc) >> 1 & 3;
                uVar31 = (ulong)uVar30;
                pppplVar21 = pppplVar25 + (uVar27 & 0xffffffff) + 1;
                pppplVar25 = (long ****)(lVar15 + (long)*(int *)pppplVar21 * 0x38);
                uVar27 = 0;
                do {
                  if ((uVar31 != uVar27) &&
                     ((*(byte *)((long)*(int *)pppplVar21 * 0x38 + lVar15 + 0xc + uVar27 * 8) & 8)
                      != 0)) goto LAB_00112e9e;
                  uVar27 = uVar27 + 1;
                } while (uVar27 != 3);
                uVar27 = 0xffffffff;
LAB_00112e9e:
                uVar28 = uVar37;
              } while (-1 < (int)uVar27);
              uVar17 = (ulong)(uVar23 != 0);
              uVar35 = *(uint *)(plVar2 + 1);
              uVar6 = *(undefined2 *)((long)pppplVar25 + (ulong)((uVar30 + 2) % 3) * 2);
              lVar16 = *plVar2;
              *(uint *)(plVar2 + 1) = uVar35 + 1;
              *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) = uVar6;
              if (iVar11 != 0) {
                *(undefined2 *)(lVar16 + (long)local_60 * 2) =
                     *(undefined2 *)(lVar16 + -2 + (long)local_60 * 2);
                *(undefined2 *)(lVar16 + 2 + (long)local_60 * 2) =
                     *(undefined2 *)(lVar16 + 4 + (long)local_60 * 2);
              }
            }
          }
          pppplVar21 = pppplVar13;
        } while (pppplVar13 != &local_70);
      }
      pppplVar21 = (long ****)local_70;
      uVar27 = uVar17;
      if ((long ****)local_70 != &local_70) {
        do {
          pppplVar25 = (long ****)*pppplVar21;
          uVar17 = uVar27;
          if ((*(byte *)((long)pppplVar21 + -0xc) >> 3 & 1) == 0 &&
              (byte)((*(byte *)((long)pppplVar21 + -0x14) >> 3 & 1) +
                    ((*(uint *)((long)pppplVar21 + -0x1c) >> 3 & 1) != 0)) == '\0') {
            uVar35 = *(uint *)(plVar2 + 1);
            if ((ulong)uVar35 != 0) {
              lVar16 = *plVar2;
              *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) =
                   *(undefined2 *)(lVar16 + (ulong)(uVar35 - 1) * 2);
              *(uint *)(plVar2 + 1) = uVar35 + 1;
              uVar6 = *(undefined2 *)((long)pppplVar21 + (ulong)((int)uVar27 == 0) * 2 + -0x28);
              *(uint *)(plVar2 + 1) = uVar35 + 2;
              *(undefined2 *)(lVar16 + (ulong)(uVar35 + 1) * 2) = uVar6;
            }
            uVar17 = (ulong)((int)uVar27 == 0);
            uVar6 = *(undefined2 *)((long)pppplVar21 + uVar17 * 2 + -0x28);
            lVar16 = *plVar2;
            uVar35 = *(uint *)(plVar2 + 1);
            *(uint *)(plVar2 + 1) = uVar35 + 1;
            *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) = uVar6;
            uVar6 = *(undefined2 *)((long)pppplVar21 + uVar27 * 2 + -0x28);
            *(uint *)(plVar2 + 1) = uVar35 + 2;
            *(undefined2 *)(lVar16 + (ulong)(uVar35 + 1) * 2) = uVar6;
            uVar6 = *(undefined2 *)((long)pppplVar21 + -0x24);
            *(uint *)(plVar2 + 1) = uVar35 + 3;
            *(undefined2 *)(lVar16 + (ulong)(uVar35 + 2) * 2) = uVar6;
          }
          pppplVar21 = pppplVar25;
          uVar27 = uVar17;
        } while (pppplVar25 != &local_70);
      }
      if ((long ****)local_80 != &local_80) {
        lVar16 = *plVar2;
        uVar35 = *(uint *)(plVar2 + 1);
        pppplVar21 = (long ****)local_80;
        do {
          pppplVar25 = (long ****)*pppplVar21;
          if (uVar35 != 0) {
            *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) =
                 *(undefined2 *)(lVar16 + (ulong)(uVar35 - 1) * 2);
            uVar28 = uVar35 + 1;
            uVar35 = uVar35 + 2;
            *(undefined2 *)(lVar16 + (ulong)uVar28 * 2) =
                 *(undefined2 *)((long)pppplVar21 + (ulong)((int)uVar17 == 0) * 2 + -0x28);
          }
          uVar27 = (ulong)((int)uVar17 == 0);
          *(undefined2 *)(lVar16 + (ulong)uVar35 * 2) =
               *(undefined2 *)((long)pppplVar21 + uVar27 * 2 + -0x28);
          uVar28 = uVar35 + 2;
          *(undefined2 *)(lVar16 + (ulong)(uVar35 + 1) * 2) =
               *(undefined2 *)((long)pppplVar21 + uVar17 * 2 + -0x28);
          uVar35 = uVar35 + 3;
          *(undefined2 *)(lVar16 + (ulong)uVar28 * 2) = *(undefined2 *)((long)pppplVar21 + -0x24);
          pppplVar21 = pppplVar25;
          uVar17 = uVar27;
        } while (pppplVar25 != &local_80);
        *(uint *)(plVar2 + 1) = uVar35;
      }
      puVar1 = &this->meshHeader->totalIndices;
      *puVar1 = *puVar1 + (int)plVar2[1];
      local_58 = local_58 + 1;
      pMVar32 = local_38;
    } while (local_58 < (this->matList).numMaterials);
  }
  (*DAT_00148850)(lVar15);
  pMVar14 = this->meshHeader;
  this->meshHeader = (MeshHeader *)0x0;
  allocateMeshes(this,(uint)pMVar14->numMeshes,pMVar14->totalIndices,0);
  local_60 = this->meshHeader;
  local_60->flags = 1;
  if (pMVar14->numMeshes != 0) {
    lVar15 = 0x10;
    uVar17 = 0;
    pvVar19 = *(void **)(local_60 + 1);
    do {
      *(undefined8 *)((long)&local_60[1].flags + lVar15) =
           *(undefined8 *)((long)&pMVar32[1].flags + lVar15);
      uVar35 = *(uint *)((long)&pMVar32->totalIndices + lVar15);
      *(uint *)((long)&local_60->totalIndices + lVar15) = uVar35;
      *(void **)((long)&local_60->flags + lVar15) = pvVar19;
      memcpy(pvVar19,*(void **)((long)&pMVar32->flags + lVar15),(ulong)uVar35 * 2);
      (*DAT_00148850)(*(undefined8 *)((long)&pMVar32->flags + lVar15));
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x18;
      pvVar19 = (void *)((long)pvVar19 + (ulong)uVar35 * 2);
    } while (uVar17 < pMVar14->numMeshes);
  }
  (*DAT_00148850)(pMVar14);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 632"
  ;
  pvVar19 = (void *)(*DAT_00148858)((long)this->numTriangles);
  uVar35 = 0;
  memset(pvVar19,0,(long)this->numTriangles);
  if (this->meshHeader->numMeshes != 0) {
    pMVar32 = this->meshHeader + 1;
    do {
      uVar28 = MaterialList::findIndex(local_50,*(Material **)(pMVar32 + 1));
      if (pMVar32->totalIndices != 2) {
        uVar17 = 0;
        uVar37 = 0;
        do {
          lVar15 = *(long *)pMVar32;
          iVar26 = (int)uVar17;
          uVar7 = *(ushort *)(lVar15 + (ulong)(uVar37 + iVar26) * 2);
          uVar37 = uVar37 ^ 1;
          uVar8 = *(ushort *)(lVar15 + (ulong)(uVar37 + iVar26) * 2);
          uVar9 = *(ushort *)(lVar15 + (ulong)(iVar26 + 2) * 2);
          iVar26 = this->numVertices;
          if (((iVar26 <= (int)(uint)uVar7) || (iVar26 <= (int)(uint)uVar8)) ||
             (iVar26 <= (int)(uint)uVar9)) {
            fprintf(_stderr,"triangle %d %d %d out of range (%d)\n");
            goto LAB_0011333d;
          }
          if (((uVar7 != uVar8) && (uVar7 != uVar9)) && (uVar8 != uVar9)) {
            if ((long)this->numTriangles < 1) goto LAB_0011333d;
            pTVar12 = this->triangles;
            lVar15 = 0;
            while (((*(char *)((long)pvVar19 + lVar15) != '\0' || (uVar28 != pTVar12[lVar15].matId))
                   || ((((uVar10 = pTVar12[lVar15].v[0], uVar10 != uVar7 ||
                         ((pTVar12[lVar15].v[1] != uVar8 || (pTVar12[lVar15].v[2] != uVar9)))) &&
                        ((pTVar12[lVar15].v[1] != uVar7 ||
                         ((pTVar12[lVar15].v[2] != uVar8 || (uVar10 != uVar9)))))) &&
                       ((pTVar12[lVar15].v[2] != uVar7 ||
                        ((uVar10 != uVar8 || (pTVar12[lVar15].v[1] != uVar9))))))))) {
              lVar15 = lVar15 + 1;
              if (this->numTriangles == lVar15) goto LAB_0011333d;
            }
            *(undefined1 *)((long)pvVar19 + lVar15) = 1;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < pMVar32->totalIndices - 2);
      }
      pMVar32 = (MeshHeader *)&pMVar32[1].totalIndices;
      uVar35 = uVar35 + 1;
    } while (uVar35 < this->meshHeader->numMeshes);
  }
  if (0 < (long)this->numTriangles) {
    lVar15 = 0;
    do {
      if (*(char *)((long)pvVar19 + lVar15) == '\0') {
LAB_0011333d:
        buildTristrips();
        allocLocation =
             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/world.cpp line: 24"
        ;
        object = (undefined4 *)(*Engine::memfuncs)((long)World::s_plglist,0x3000b);
        if (object == (undefined4 *)0x0) {
          World::create();
        }
        else {
          World::numAllocated = World::numAllocated + 1;
          *object = 7;
          *(undefined8 *)(object + 2) = 0;
          *(undefined4 **)(object + 4) = object + 4;
          *(undefined4 **)(object + 6) = object + 4;
          *(undefined4 **)(object + 8) = object + 8;
          *(undefined4 **)(object + 10) = object + 8;
          *(undefined4 **)(object + 0xc) = object + 0xc;
          *(undefined4 **)(object + 0xe) = object + 0xc;
          PluginList::construct((PluginList *)&World::s_plglist,object);
        }
        return;
      }
      lVar15 = lVar15 + 1;
    } while (this->numTriangles != lVar15);
  }
  (*DAT_00148850)(pvVar19);
  return;
}

Assistant:

void
Geometry::buildTristrips(void)
{
	int32 i;
	uint16 *indices;
	MeshHeader *header;
	Mesh *ms, *md;
	StripMesh smesh;

//	trace("%ld\n", sizeof(StripNode));

	this->allocateMeshes(matList.numMaterials, 0, 1);

	smesh.nodes = rwNewT(StripNode, this->numTriangles, MEMDUR_FUNCTION | ID_GEOMETRY);
	ms = this->meshHeader->getMeshes();
	for(int32 i = 0; i < this->matList.numMaterials; i++){
		smesh.loneNodes.init();
		smesh.endNodes.init();
		collectFaces(this, &smesh, i);
		connectNodesPreserve(&smesh);
		buildStrips(&smesh);
printSmesh(&smesh);
//trace("-------\n");
//printLone(&smesh);
//trace("-------\n");
//printEnds(&smesh);
//trace("-------\n");
		// TODO: make this work
//		tunnel(&smesh);
//trace("-------\n");
//printEnds(&smesh);

		ms[i].material = this->matList.materials[i];
		makeMesh(&smesh, &ms[i]);
		this->meshHeader->totalIndices += ms[i].numIndices;
	}
	rwFree(smesh.nodes);

	/* Now re-allocate and copy data */
	header = this->meshHeader;
	this->meshHeader = nil;
	this->allocateMeshes(header->numMeshes, header->totalIndices, 0);
	this->meshHeader->flags = MeshHeader::TRISTRIP;
	md = this->meshHeader->getMeshes();
	indices = md->indices;
	for(i = 0; i < header->numMeshes; i++){
		md[i].material = ms[i].material;
		md[i].numIndices = ms[i].numIndices;
		md[i].indices = indices;
		indices += md[i].numIndices;
		memcpy(md[i].indices, ms[i].indices, md[i].numIndices*sizeof(uint16));
		rwFree(ms[i].indices);
	}
	rwFree(header);

	verifyMesh(this);
}